

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rankValueFunc(sqlite3_context *pCtx)

{
  Mem *pMem;
  i64 *piVar1;
  
  if ((pCtx->pMem->flags & 0x2000) == 0) {
    piVar1 = (i64 *)createAggContext(pCtx,0x18);
  }
  else {
    piVar1 = (i64 *)pCtx->pMem->z;
  }
  if (piVar1 != (i64 *)0x0) {
    pMem = pCtx->pOut;
    if ((pMem->flags & 0x2400) == 0) {
      (pMem->u).i = *piVar1;
      pMem->flags = 4;
    }
    else {
      vdbeReleaseAndSetInt64(pMem,*piVar1);
    }
    *piVar1 = 0;
  }
  return;
}

Assistant:

static void rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    sqlite3_result_int64(pCtx, p->nValue);
    p->nValue = 0;
  }
}